

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O3

iterator * __thiscall
r_code::time_buffer<r_exec::Input,_r_exec::Input::IsInvalidated>::iterator::operator++
          (iterator *this)

{
  time_buffer<r_exec::Input,_r_exec::Input::IsInvalidated> *ptVar1;
  long lVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  int64_t *piVar5;
  uintptr_t uVar6;
  uintptr_t *puVar7;
  
  ptVar1 = this->buffer;
  lVar2 = (long)(ptVar1->super_list<r_exec::Input>).cells.
                super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uintptr_t *)(lVar2 + this->_cell * 0x38);
  this->_cell = uVar6;
  if (uVar6 != 0) {
    do {
      if (ptVar1->time_reference - *(long *)(lVar2 + 0x30 + uVar6 * 0x38) <= ptVar1->thz) {
        return this;
      }
      puVar7 = (uintptr_t *)(uVar6 * 0x38 + lVar2);
      uVar3 = *puVar7;
      uVar4 = puVar7[1];
      piVar5 = (int64_t *)(uVar4 * 0x38 + lVar2);
      if (uVar4 == 0xffffffffffffffff) {
        piVar5 = &(ptVar1->super_list<r_exec::Input>).used_cells_head;
      }
      *piVar5 = uVar3;
      piVar5 = (int64_t *)(lVar2 + 8 + uVar3 * 0x38);
      if (uVar3 == 0xffffffffffffffff) {
        piVar5 = &(ptVar1->super_list<r_exec::Input>).used_cells_tail;
      }
      *piVar5 = uVar4;
      *puVar7 = (ptVar1->super_list<r_exec::Input>).free_cells;
      (ptVar1->super_list<r_exec::Input>).free_cells = uVar6;
      (ptVar1->super_list<r_exec::Input>).used_cell_count =
           (ptVar1->super_list<r_exec::Input>).used_cell_count - 1;
      (ptVar1->super_list<r_exec::Input>).free_cell_count =
           (ptVar1->super_list<r_exec::Input>).free_cell_count + 1;
      this->_cell = uVar3;
      uVar6 = uVar3;
    } while (uVar3 != 0);
  }
  return this;
}

Assistant:

iterator &operator ++()   // moves to the next time-compliant cell and erase old cells met in the process.
        {
            _cell = buffer->cells[_cell].next;

            if (_cell != 0) {
                IsInvalidated i;
check:

                if (i(buffer->cells[_cell].data, buffer->time_reference, buffer->thz)) {
                    _cell = buffer->_erase(_cell);

                    if (_cell != 0) {
                        goto check;
                    }
                }
            }

            return *this;
        }